

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_pfx.cpp
# Opt level: O3

void Palette16Generic(PalEntry *pal)

{
  byte bVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  BYTE BVar5;
  BYTE BVar6;
  BYTE BVar7;
  undefined1 uVar8;
  long lVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  
  uVar8 = GPfx._15_1_;
  BVar7 = GPfx.GreenShift;
  BVar6 = GPfx.BlueShift;
  BVar5 = GPfx.RedShift;
  uVar4 = GPfx.Masks.Bits16.Blue;
  uVar3 = GPfx.Masks.Bits16.Green;
  uVar2 = GPfx.Masks.Bits16.Red;
  lVar9 = 0;
  do {
    bVar1 = *(byte *)((long)&pal->field_0 + lVar9 * 2 + 2);
    uVar10 = (ushort)(bVar1 >> (BVar5 & 0x1f));
    if ((uVar8 & 1) != 0) {
      uVar10 = (ushort)bVar1 << (BVar5 & 0x1f);
    }
    bVar1 = *(byte *)((long)&pal->field_0 + lVar9 * 2 + 1);
    uVar12 = (ushort)(bVar1 >> (BVar7 & 0x1f));
    if ((uVar8 & 4) != 0) {
      uVar12 = (ushort)bVar1 << (BVar7 & 0x1f);
    }
    bVar1 = *(byte *)((long)&pal->field_0 + lVar9 * 2);
    uVar11 = (ushort)(bVar1 >> (BVar6 & 0x1f));
    if ((uVar8 & 2) != 0) {
      uVar11 = (ushort)bVar1 << (BVar6 & 0x1f);
    }
    *(ushort *)((long)&GPfxPal + lVar9) = uVar11 & uVar4 | uVar12 & uVar3 | uVar10 & uVar2;
    lVar9 = lVar9 + 2;
  } while ((int)lVar9 != 0x200);
  return;
}

Assistant:

static void Palette16Generic (const PalEntry *pal)
{
	WORD *p16;
	int i;

	for (p16 = GPfxPal.Pal16, i = 256; i != 0; i--, pal++, p16++)
	{
		WORD rpart, gpart, bpart;

		if (GPfx.RedLeft)	rpart = pal->r << GPfx.RedShift;
		else				rpart = pal->r >> GPfx.RedShift;

		if (GPfx.GreenLeft)	gpart = pal->g << GPfx.GreenShift;
		else				gpart = pal->g >> GPfx.GreenShift;

		if (GPfx.BlueLeft)	bpart = pal->b << GPfx.BlueShift;
		else				bpart = pal->b >> GPfx.BlueShift;

		*p16 = (rpart & GPfx.Masks.Bits16.Red) |
			   (gpart & GPfx.Masks.Bits16.Green) |
			   (bpart & GPfx.Masks.Bits16.Blue);
	}
}